

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

void __thiscall
FOptionMenuNumberField::FOptionMenuNumberField
          (FOptionMenuNumberField *this,char *label,char *menu,float minimum,float maximum,
          float step,char *graycheck)

{
  char *graycheck_local;
  float step_local;
  float maximum_local;
  float minimum_local;
  char *menu_local;
  char *label_local;
  FOptionMenuNumberField *this_local;
  
  FOptionMenuFieldBase::FOptionMenuFieldBase(&this->super_FOptionMenuFieldBase,label,menu,graycheck)
  ;
  (this->super_FOptionMenuFieldBase).super_FOptionMenuItem.super_FListMenuItem._vptr_FListMenuItem =
       (_func_int **)&PTR__FOptionMenuNumberField_009ee4a0;
  this->mMinimum = minimum;
  this->mMaximum = maximum;
  this->mStep = step;
  if (this->mMaximum <= this->mMinimum) {
    swapvalues<float>(&this->mMinimum,&this->mMaximum);
  }
  if (this->mStep <= 0.0) {
    this->mStep = 1.0;
  }
  return;
}

Assistant:

FOptionMenuNumberField ( const char *label, const char* menu, float minimum, float maximum,
		float step, const char* graycheck )
		: FOptionMenuFieldBase ( label, menu, graycheck ),
		mMinimum ( minimum ),
		mMaximum ( maximum ),
		mStep ( step )
	{
		if ( mMaximum <= mMinimum )
			swapvalues( mMinimum, mMaximum );

		if ( mStep <= 0 )
			mStep = 1;
	}